

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Binasc.cpp
# Opt level: O2

int __thiscall smf::Binasc::writeToBinary(Binasc *this,string *outfile,istream *input)

{
  char cVar1;
  int iVar2;
  ostream *poVar3;
  ofstream output;
  
  std::ofstream::ofstream(&output);
  std::ofstream::open((char *)&output,(_Ios_Openmode)(outfile->_M_dataplus)._M_p);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 == '\0') {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Cannot open ");
    poVar3 = std::operator<<(poVar3,(string *)outfile);
    poVar3 = std::operator<<(poVar3," for reading in binasc.");
    iVar2 = 0;
    std::endl<char,std::char_traits<char>>(poVar3);
  }
  else {
    iVar2 = writeToBinary(this,(ostream *)&output,input);
    std::ofstream::close();
  }
  std::ofstream::~ofstream(&output);
  return iVar2;
}

Assistant:

int Binasc::writeToBinary(const std::string& outfile, std::istream& input) {
	std::ofstream output;
	output.open(outfile.c_str());
	if (!output.is_open()) {
		std::cerr << "Cannot open " << outfile
		          << " for reading in binasc." << std::endl;
		return 0;
	}

	int status = writeToBinary(output, input);
	output.close();
	return status;
}